

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::ConvertItems(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *this)

{
  OutputModelInfo(this,"AMPL MP initial flat model",false,"flat0_");
  ConicConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::Run(&this->conic_cvt_);
  ConstraintManager::ConvertAllConstraints
            (&(this->super_FlatModel<mp::DefaultFlatModelParams>).super_ConstraintManager,
             (BasicFlatConverter *)this);
  this->constr_depth_ = 1;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ConsiderEmulatingMultiobj
            (&this->
              super_MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            );
  return;
}

Assistant:

void ConvertItems() {
    try {
      MPD( OutputModelInfo("AMPL MP initial flat model", 0, "flat0_"); );
			MPD( Convert2Cones(); );                 // sweep before other conversions
      MP_DISPATCH( ConvertAllConstraints() );
      // MP_DISPATCH( PreprocessIntermediate() );     // preprocess after each level
      constr_depth_ = 1;  // Workaround. TODO have maps as special constraints
			MP_DISPATCH( ConvertMaps() );
      MP_DISPATCH( PreprocessFlatFinal() );           // final flat model prepro
      MP_DISPATCH( ConsiderEmulatingMultiobj() );     // Before NL conversion
      if constexpr (IfAcceptingNLOutput()) {
        if (IfWantNLOutput()) {
          MPD( Convert2NL() );                        // Possibly for emulated objectives
          MPD( PreprocessNLFinal() );
        }
      }
    } catch (const ConstraintConversionFailure& cff) {
      MP_RAISE(cff.message());
    }
  }